

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

Name __thiscall
wasm::FuncCastEmulation::makeThunk(FuncCastEmulation *this,Name name,Module *module,Index numParams)

{
  MixedArena *this_00;
  Name name_00;
  IString IVar1;
  Name name_01;
  Name target;
  undefined1 auVar2 [8];
  size_t type;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> this_01;
  Function *pFVar3;
  Type *pTVar4;
  LocalGet *value;
  Call *value_00;
  Index IVar5;
  bool bVar6;
  Signature SVar7;
  Iterator IVar8;
  Name name_02;
  undefined1 auStack_278 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  Builder local_f0;
  Builder builder;
  Type local_e0;
  Type *local_d8;
  Type local_d0;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_c8;
  string local_a8;
  undefined1 local_88 [8];
  Name thunk;
  Name name_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> thunkParams;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> thunkFunc;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  thunk.super_IString.str._M_str = name.super_IString.str._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_local.super_IString.str._M_str,"byn$fpcast-emu$",
             (allocator<char> *)&local_c8);
  IString::toString_abi_cxx11_(&local_a8,(IString *)&thunk.super_IString.str._M_str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_local.super_IString.str._M_str,&local_a8);
  IString::IString((IString *)local_88,(string *)auStack_278);
  std::__cxx11::string::~string((string *)auStack_278);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&name_local.super_IString.str._M_str);
  name_00.super_IString.str._M_str = (char *)thunk.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)local_88;
  pFVar3 = Module::getFunctionOrNull(module,name_00);
  if (pFVar3 == (Function *)0x0) {
    name_01.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)thunk.super_IString.str._M_str;
    pFVar3 = Module::getFunction(module,name_01);
    SVar7 = HeapType::getSignature(&pFVar3->type);
    local_d0 = SVar7.results.id;
    auStack_278 = (undefined1  [8])0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.wasm = module;
    thunkFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
    SVar7 = HeapType::getSignature(&pFVar3->type);
    local_a8._M_dataplus._M_p = (pointer)SVar7.params.id;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    name_local.super_IString.str._M_str = (char *)&local_a8;
    IVar8 = wasm::Type::end((Type *)&local_a8);
    local_d8 = IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    this_00 = (MixedArena *)
              ((long)thunkFunc._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x158);
    IVar5 = 0;
    while ((thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
           || ((Type *)name_local.super_IString.str._M_str != local_d8))) {
      pTVar4 = wasm::Type::Iterator::operator*((Iterator *)&name_local.super_IString.str._M_str);
      value = MixedArena::alloc<wasm::LocalGet>(this_00);
      value->index = IVar5;
      (value->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 3;
      local_c8._M_impl.super__Vector_impl_data._M_start =
           (pointer)fromABI((Expression *)value,(Type)pTVar4->id,
                            (Module *)
                            thunkFunc._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_278,
                 (Expression **)&local_c8);
      thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&(thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id + 1);
      IVar5 = IVar5 + 1;
    }
    target.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    target.super_IString.str._M_len = (size_t)thunk.super_IString.str._M_str;
    value_00 = Builder::makeCall(&local_f0,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 auStack_278,local_d0,false);
    name_local.super_IString.str._M_str = (char *)0x0;
    while (type = thunk.super_IString.str._M_len, auVar2 = local_88, bVar6 = numParams != 0,
          numParams = numParams - 1, bVar6) {
      local_a8._M_dataplus._M_p = (pointer)0x3;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &name_local.super_IString.str._M_str,(Type *)&local_a8);
    }
    Tuple::Tuple((Tuple *)&local_a8,(TypeList *)&name_local.super_IString.str._M_str);
    wasm::Type::Type(&local_e0,(Tuple *)&local_a8);
    SVar7.results.id = 3;
    SVar7.params.id = local_e0.id;
    HeapType::HeapType((HeapType *)&builder,SVar7);
    this_01 = thunkFunc;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    toABI((Expression *)value_00,
          (Module *)
          thunkFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
          ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    name_02.super_IString.str._M_str = (char *)auVar2;
    name_02.super_IString.str._M_len = (size_t)&local_40;
    Builder::makeFunction
              (name_02,(HeapType)type,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)builder.wasm,
               (Expression *)&local_c8);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_c8);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&local_a8);
    Module::addFunction((Module *)
                        this_01._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,&local_40);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_40);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
               &name_local.super_IString.str._M_str);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_278)
    ;
    IVar1.str._M_str = (char *)thunk.super_IString.str._M_len;
    IVar1.str._M_len = (size_t)local_88;
    return (IString)(IString)IVar1.str;
  }
  Fatal::Fatal((Fatal *)auStack_278);
  Fatal::operator<<((Fatal *)auStack_278,
                    (char (*) [103])
                    "FuncCastEmulation::makeThunk seems a thunk name already in use. Was the pass already run on this code?"
                   );
  Fatal::~Fatal((Fatal *)auStack_278);
}

Assistant:

Name makeThunk(Name name, Module* module, Index numParams) {
    Name thunk = std::string("byn$fpcast-emu$") + name.toString();
    if (module->getFunctionOrNull(thunk)) {
      Fatal() << "FuncCastEmulation::makeThunk seems a thunk name already in "
                 "use. Was the pass already run on this code?";
    }
    // The item in the table may be a function or a function import.
    auto* func = module->getFunction(name);
    Type type = func->getResults();
    Builder builder(*module);
    std::vector<Expression*> callOperands;
    Index i = 0;
    for (const auto& param : func->getParams()) {
      callOperands.push_back(
        fromABI(builder.makeLocalGet(i++, Type::i64), param, module));
    }
    auto* call = builder.makeCall(name, callOperands, type);
    std::vector<Type> thunkParams;
    for (Index i = 0; i < numParams; i++) {
      thunkParams.push_back(Type::i64);
    }
    auto thunkFunc =
      builder.makeFunction(thunk,
                           Signature(Type(thunkParams), Type::i64),
                           {}, // no vars
                           toABI(call, module));
    module->addFunction(std::move(thunkFunc));
    return thunk;
  }